

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O0

int Abc_NodeMffcLabelAig(Abc_Obj_t *pNode)

{
  int iVar1;
  int nConeSize2;
  int nConeSize1;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NtkIsStrash(pNode->pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcRefs.c"
                  ,0x67,"int Abc_NodeMffcLabelAig(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcRefs.c"
                  ,0x68,"int Abc_NodeMffcLabelAig(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcRefs.c"
                  ,0x69,"int Abc_NodeMffcLabelAig(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjFaninNum(pNode);
  if (iVar1 == 0) {
    pNode_local._4_4_ = 0;
  }
  else {
    pNode_local._4_4_ = Abc_NodeRefDeref(pNode,0,1);
    iVar1 = Abc_NodeRefDeref(pNode,1,0);
    if (pNode_local._4_4_ != iVar1) {
      __assert_fail("nConeSize1 == nConeSize2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcRefs.c"
                    ,0x6e,"int Abc_NodeMffcLabelAig(Abc_Obj_t *)");
    }
    if (pNode_local._4_4_ < 1) {
      __assert_fail("nConeSize1 > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcRefs.c"
                    ,0x6f,"int Abc_NodeMffcLabelAig(Abc_Obj_t *)");
    }
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NodeMffcLabelAig( Abc_Obj_t * pNode )
{
    int nConeSize1, nConeSize2;
    assert( Abc_NtkIsStrash(pNode->pNtk) );
    assert( !Abc_ObjIsComplement( pNode ) );
    assert( Abc_ObjIsNode( pNode ) );
    if ( Abc_ObjFaninNum(pNode) == 0 )
        return 0;
    nConeSize1 = Abc_NodeRefDeref( pNode, 0, 1 ); // dereference
    nConeSize2 = Abc_NodeRefDeref( pNode, 1, 0 ); // reference
    assert( nConeSize1 == nConeSize2 );
    assert( nConeSize1 > 0 );
    return nConeSize1;
}